

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_rightmost_tiles(tgestate_t *state)

{
  long in_RDI;
  uint8_t x;
  supertileindex_t *unaff_retaddr;
  uint8_t *window;
  supertileindex_t *maptiles;
  tileindex_t *vistiles;
  
  plot_vertical_tiles_common
            ((tgestate_t *)maptiles,window,unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38),
             (uint8_t *)(*(long *)(in_RDI + 0x790) + 0x17));
  return;
}

Assistant:

void plot_rightmost_tiles(tgestate_t *state)
{
  tileindex_t      *vistiles; /* was DE */
  supertileindex_t *maptiles; /* was HL' */
  uint8_t          *window;   /* was DE' */
  uint8_t           x;        /* was A */

  assert(state != NULL);

  // 23 -> state->columns - 1
  //  6 -> state->st_columns - 1

  vistiles = &state->tile_buf[23];   /* visible tiles array */
  maptiles = &state->map_buf[6];     /* 7x5 supertile refs */
  window   = &state->window_buf[23]; /* screen buffer start address */
  x        = state->map_position.x;  /* map_position x */

  x &= 3;
  if (x == 0)
    maptiles--;
  x = state->map_position.x - 1; /* map_position x */

  plot_vertical_tiles_common(state, vistiles, maptiles, x, window);
}